

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

char * __thiscall libtorrent::allocate_string_copy(libtorrent *this,string_view str)

{
  char *__dest;
  ptrdiff_t _Num;
  char *__n;
  
  __n = str.ptr_;
  if (__n == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    __dest = (char *)operator_new__((ulong)(__n + 1));
    memcpy(__dest,this,(size_t)__n);
    __dest[(long)__n] = '\0';
  }
  return __dest;
}

Assistant:

int search(span<char const> src, span<char const> target)
	{
		TORRENT_ASSERT(!src.empty());
		TORRENT_ASSERT(!target.empty());
		TORRENT_ASSERT(target.size() >= src.size());
		TORRENT_ASSERT(target.size() < std::numeric_limits<int>::max());

		auto const it = std::search(target.begin(), target.end(), src.begin(), src.end());

		// no complete sync
		if (it == target.end()) return -1;
		return static_cast<int>(it - target.begin());
	}